

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::TextureBarrierBasicOutline::iterate(TextureBarrierBasicOutline *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 uVar4;
  uint uVar5;
  TestLog *log_00;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  ShaderProgram *pSVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TestError *pTVar8;
  uint local_178;
  uint local_174;
  int renderPass_1;
  int renderPass;
  int testPass;
  GLint loc;
  GLchar samplerName [12];
  allocator<char> local_151;
  GLuint i;
  allocator<char> local_12d [13];
  string local_120;
  ProgramSources local_100;
  undefined1 local_30 [8];
  SharedPtr<glu::ShaderProgram> program;
  Functions *gl;
  TestLog *log;
  TextureBarrierBasicOutline *this_local;
  
  log_00 = tcu::TestContext::getLog
                     ((this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  pRVar6 = deqp::Context::getRenderContext
                     ((this->super_TextureBarrierBaseTest).super_TestCase.m_context);
  iVar2 = (*pRVar6->_vptr_RenderContext[3])();
  program.m_state = (SharedPtrStateBase *)CONCAT44(extraout_var,iVar2);
  pSVar7 = (ShaderProgram *)operator_new(0xd0);
  pRVar6 = deqp::Context::getRenderContext
                     ((this->super_TextureBarrierBaseTest).super_TestCase.m_context);
  iVar2 = (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[5])();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,(char *)CONCAT44(extraout_var_00,iVar2),local_12d);
  iVar2 = (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[6])();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i,(char *)CONCAT44(extraout_var_01,iVar2),&local_151);
  glu::makeVtxFragSources(&local_100,&local_120,(string *)&i);
  glu::ShaderProgram::ShaderProgram(pSVar7,pRVar6,&local_100);
  de::SharedPtr<glu::ShaderProgram>::SharedPtr((SharedPtr<glu::ShaderProgram> *)local_30,pSVar7);
  glu::ProgramSources::~ProgramSources(&local_100);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(local_12d);
  pSVar7 = de::SharedPtr<glu::ShaderProgram>::operator*((SharedPtr<glu::ShaderProgram> *)local_30);
  glu::operator<<(log_00,pSVar7);
  pSVar7 = de::SharedPtr<glu::ShaderProgram>::operator->((SharedPtr<glu::ShaderProgram> *)local_30);
  bVar1 = glu::ShaderProgram::isOk(pSVar7);
  if (!bVar1) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Program compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureBarrierTests.cpp"
               ,0x1a0);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pSVar7 = de::SharedPtr<glu::ShaderProgram>::operator->((SharedPtr<glu::ShaderProgram> *)local_30);
  dVar3 = glu::ShaderProgram::getProgram(pSVar7);
  *(deUint32 *)&(this->super_TextureBarrierBaseTest).field_0x7c = dVar3;
  (*(code *)program.m_state[0x168]._vptr_SharedPtrStateBase)
            (*(undefined4 *)&(this->super_TextureBarrierBaseTest).field_0x7c);
  samplerName[8] = '\0';
  samplerName[9] = '\0';
  samplerName[10] = '\0';
  samplerName[0xb] = '\0';
  for (; (uint)samplerName._8_4_ < 8; samplerName._8_4_ = samplerName._8_4_ + 1) {
    _testPass = 0x7475706e49786574;
    samplerName[1] = samplerName[8] + '0';
    samplerName[0] = '[';
    samplerName[2] = ']';
    samplerName[3] = '\0';
    uVar4 = (**(code **)&program.m_state[0xb4].strongRefCount)
                      (*(undefined4 *)&(this->super_TextureBarrierBaseTest).field_0x7c,&testPass);
    (*(code *)program.m_state[0x14f]._vptr_SharedPtrStateBase)(uVar4);
  }
  renderPass_1 = 0;
  while( true ) {
    iVar2 = (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[8])();
    if (iVar2 <= renderPass_1) {
      (*(code *)program.m_state[0x168]._vptr_SharedPtrStateBase)(0);
      tcu::TestContext::setTestResult
                ((this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      de::SharedPtr<glu::ShaderProgram>::~SharedPtr((SharedPtr<glu::ShaderProgram> *)local_30);
      return STOP;
    }
    initTextureData(this);
    for (local_174 = 0;
        iVar2 = (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
                  _vptr_TestNode[9])(), (int)local_174 < iVar2; local_174 = local_174 + 1) {
      (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[10])(this,(ulong)(uint)renderPass_1,(ulong)local_174);
      render(this);
      uVar5 = (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
                _vptr_TestNode[0xb])();
      if ((uVar5 & 1) != 0) {
        (*(code *)program.m_state[0x13d]._vptr_SharedPtrStateBase)();
      }
    }
    for (local_178 = 0;
        iVar2 = (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
                  _vptr_TestNode[9])(), (int)local_178 < iVar2; local_178 = local_178 + 1) {
      (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[10])(this,(ulong)(uint)renderPass_1,(ulong)local_178);
      (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[7])();
    }
    bVar1 = verifyTextureData(this);
    if (!bVar1) break;
    renderPass_1 = renderPass_1 + 1;
  }
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar8,"Failed to validate rendering results",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureBarrierTests.cpp"
             ,0x1ce);
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IterateResult iterate()
	{
		tcu::TestLog&		  log = m_testCtx.getLog();
		const glw::Functions& gl  = m_context.getRenderContext().getFunctions();

		// Compile & link the program to use
		de::SharedPtr<glu::ShaderProgram> program(
			new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vsh(), fsh())));
		log << (*program);
		if (!program->isOk())
		{
			TCU_FAIL("Program compilation failed");
		}
		m_program = program->getProgram();

		gl.useProgram(m_program);

		for (GLuint i = 0; i < NUM_TEXTURES; ++i)
		{
			GLchar samplerName[] = "texInput[0]";
			samplerName[9]		 = static_cast<GLchar>('0' + i);
			GLint loc			 = gl.getUniformLocation(m_program, samplerName);
			gl.uniform1i(loc, i);
		}

		for (int testPass = 0; testPass < numTestPasses(); ++testPass)
		{
			// Initialize texture data at the beginning of each test pass
			initTextureData();

			// Perform rendering passes
			for (int renderPass = 0; renderPass < numRenderPasses(); ++renderPass)
			{
				// Setup render pass
				setupRenderPass(testPass, renderPass);

				// Render a set of primitives that cover each pixel of the framebuffer exactly once
				render();

				// If a TextureBarrier is needed insert it here
				if (needsBarrier())
					gl.textureBarrier();
			}

			// Update reference data after actual rendering to avoid bubbles
			for (int renderPass = 0; renderPass < numRenderPasses(); ++renderPass)
			{
				// Setup render pass
				setupRenderPass(testPass, renderPass);

				// Update reference data
				updateTextureData();
			}

			// Verify results at the end of each test pass
			if (!verifyTextureData())
			{
				TCU_FAIL("Failed to validate rendering results");
			}
		}

		gl.useProgram(0);

		// Test case passed
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}